

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O0

CFastSet<char> * __thiscall CFastSet<char>::operator+=(CFastSet<char> *this,CFastSet<char> *set)

{
  size_t *psVar1;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  insert_iterator<std::set<char,_std::less<char>,_std::allocator<char>_>_> __result;
  undefined1 local_b8 [8];
  CSet result;
  CSet b;
  undefined1 local_48 [8];
  CSet a;
  CFastSet<char> *set_local;
  CFastSet<char> *this_local;
  
  a._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)set;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_48);
  GetSet(this,(set<char,_std::less<char>,_std::allocator<char>_> *)local_48);
  psVar1 = &result._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)psVar1);
  GetSet((CFastSet<char> *)a._M_t._M_impl.super__Rb_tree_header._M_node_count,(CSet *)psVar1);
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_b8);
  __first1 = std::set<char,_std::less<char>,_std::allocator<char>_>::begin
                       ((set<char,_std::less<char>,_std::allocator<char>_> *)local_48);
  __last1 = std::set<char,_std::less<char>,_std::allocator<char>_>::end
                      ((set<char,_std::less<char>,_std::allocator<char>_> *)local_48);
  psVar1 = &result._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __first2 = std::set<char,_std::less<char>,_std::allocator<char>_>::begin
                       ((set<char,_std::less<char>,_std::allocator<char>_> *)psVar1);
  __last2 = std::set<char,_std::less<char>,_std::allocator<char>_>::end
                      ((set<char,_std::less<char>,_std::allocator<char>_> *)psVar1);
  __i = std::set<char,_std::less<char>,_std::allocator<char>_>::end
                  ((set<char,_std::less<char>,_std::allocator<char>_> *)local_b8);
  __result = std::inserter<std::set<char,std::less<char>,std::allocator<char>>>
                       ((set<char,_std::less<char>,_std::allocator<char>_> *)local_b8,__i);
  std::
  set_union<std::_Rb_tree_const_iterator<char>,std::_Rb_tree_const_iterator<char>,std::insert_iterator<std::set<char,std::less<char>,std::allocator<char>>>>
            ((_Rb_tree_const_iterator<char>)__first1._M_node,
             (_Rb_tree_const_iterator<char>)__last1._M_node,
             (_Rb_tree_const_iterator<char>)__first2._M_node,
             (_Rb_tree_const_iterator<char>)__last2._M_node,__result);
  operator=(this,(CSet *)local_b8);
  std::set<char,_std::less<char>,_std::allocator<char>_>::~set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_b8);
  std::set<char,_std::less<char>,_std::allocator<char>_>::~set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)
             &result._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<char,_std::less<char>,_std::allocator<char>_>::~set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_48);
  return this;
}

Assistant:

CFastSet<T>& CFastSet<T>::operator+=(const CFastSet& set)
{
	CSet a;
	GetSet( &a );
	CSet b;
	set.GetSet( &b );
	CSet result;

	std::set_union( a.begin(), a.end(), b.begin(), b.end(),
		std::inserter( result, result.end() ) );

	*this = result;

	return *this;
}